

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  byte bVar1;
  byte bVar2;
  time_t tVar3;
  __int32_t **pp_Var4;
  char cVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  char input [1024];
  byte local_418 [1032];
  
  pbVar6 = local_418;
  pbVar7 = local_418;
  pbVar8 = local_418;
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  puts("Please enter a string, consisting only of alphanumeric characters and spaces:");
  printf("> ");
  fgets((char *)local_418,0x400,_stdin);
  do {
    cVar5 = *pbVar6;
    if (cVar5 == '\0') {
LAB_0010121e:
      putchar(10);
      puts("The encoded version is as follows:");
      while (local_418[0] != 0) {
        pbVar7 = pbVar7 + 1;
        bVar1 = encode(local_418[0]);
        putchar((uint)bVar1);
        local_418[0] = *pbVar7;
      }
      puts("\n");
      puts("The decoded version is as follows:");
      do {
        bVar1 = *pbVar8;
        bVar2 = 0x45;
        if (bVar1 != 0x20) {
          if (bVar1 == 0) {
            putchar(10);
            return 0;
          }
          bVar2 = 0x20;
          if ((9 < (byte)(bVar1 - 0x30)) && (bVar2 = 0x2d, (byte)(bVar1 + 0xbf) < 0x1a)) {
            if ((bVar1 & 1) == 0) {
              bVar2 = bVar1 - 4;
            }
            else {
              cVar5 = -6;
              if ((char)bVar1 < 'G') {
                cVar5 = '\x14';
              }
              bVar2 = cVar5 + bVar1;
            }
          }
        }
        putchar((uint)bVar2);
        pbVar8 = pbVar8 + 1;
      } while( true );
    }
    if (cVar5 == '\n') {
      *pbVar6 = '\0';
      goto LAB_0010121e;
    }
    pp_Var4 = __ctype_toupper_loc();
    *pbVar6 = (char)(*pp_Var4)[cVar5];
    pbVar6 = (byte *)((char *)pbVar6 + 1);
  } while( true );
}

Assistant:

int main(int argc, char* argv[]) {
  bool is_valid = false;
  char input[1024];

  srand((unsigned int)time(0));

  do {
    printf("Please enter a string, consisting only of alphanumeric characters and spaces:\n");
    printf("> ");

    fgets(input, sizeof input, stdin);

    is_valid = true;
    size_t n = 0;
    for (; input[n] != '\n' && input[n] != 0; n++) {
      input[n] = (char)toupper(input[n]);
      if (!( // <- notice the !
          (input[n] >= 'A' && input[n] <= 'Z')
          || (input[n] >= '0' && input[n] <= '9')
          || input[n] != ' '
          || input[n] != '-')
        ) {
        is_valid = false;
        break;
      }
    }
    if (input[n] == '\n') input[n] = 0;
  } while (!is_valid);

  printf("\n");

  printf("The encoded version is as follows:\n");
  for (size_t n = 0; input[n]; n++) {
    printf("%c", encode(input[n]));
  }
  printf("\n\n");

  printf("The decoded version is as follows:\n");
  for (size_t n = 0; input[n]; n++) {
    printf("%c", decode(input[n]));
  }
  printf("\n");

  return 0;
}